

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O2

void __thiscall
ExternalFixupMembersImport_Addend_Test::TestBody(ExternalFixupMembersImport_Addend_Test *this)

{
  database *db;
  char *pcVar1;
  char *in_R9;
  error_code eVar2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  mock_mutex mutex;
  AssertionResult gtest_ar__1;
  external_fixup_collection fixups;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1a0;
  AssertHelper local_198;
  not_null<pstore::transaction_base_*> local_190;
  parser<pstore::exchange::import_ns::callbacks> parser1;
  not_null<external_fixup_collection_*> local_e0;
  string_mapping imported_names;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  
  db = &(this->super_ExternalFixupMembersImport).db_;
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&parser1,&mutex);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,db,(lock_type *)&parser1);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&parser1);
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.strings_;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.views_;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_names.lookup_._M_h._M_buckets = &imported_names.lookup_._M_h._M_single_bucket;
  imported_names.lookup_._M_h._M_bucket_count = 1;
  imported_names.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  imported_names.lookup_._M_h._M_element_count = 0;
  imported_names.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  imported_names.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  imported_names.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_190.ptr_ = &transaction.super_transaction_base;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  pstore::gsl::not_null<pstore::transaction_base_*>::ensure_invariant(&local_190);
  std::__cxx11::string::string((string *)&parser1,"name",(allocator *)&gtest_ar_);
  eVar2 = pstore::exchange::import_ns::string_mapping::add_string
                    (&imported_names,(not_null<transaction_base_*>)local_190.ptr_,(string *)&parser1
                    );
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )eVar2._M_cat;
  gtest_ar__1._0_4_ = eVar2._M_value;
  fixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)fixups.
                        super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  fixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)std::_V2::system_category();
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&gtest_ar,"imported_names.add_string (&transaction, \"name\")",
             "std::error_code{}",(error_code *)&gtest_ar__1,(error_code *)&fixups);
  std::__cxx11::string::~string((string *)&parser1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&parser1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x24f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&parser1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    if ((__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
         )parser1.singletons_._M_t.
          super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
          .
          super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
         )0x0) {
      (**(code **)(*(long *)parser1.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                            ._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    fixups.
    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fixups.
    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fixups.
    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string
              ((string *)&gtest_ar,"{ \"name\":0, \"type\":17, \"offset\":19 }",
               (allocator *)&gtest_ar__1);
    local_e0.ptr_ =
         (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *)
         &fixups;
    pstore::gsl::
    not_null<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>
    ::ensure_invariant(&local_e0);
    anon_unknown.dwarf_38d868::ExternalFixupMembersImport::parse
              (&parser1,(string *)&gtest_ar,db,&imported_names,local_e0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = parser1.error_._M_value == 0;
    if (parser1.error_._M_value != 0) {
      testing::Message::Message((Message *)&local_1a0);
      std::operator<<((ostream *)(local_1a0._M_head_impl + 0x10),"JSON error was: ");
      (**(code **)(*(long *)parser1.error_._M_cat + 0x20))
                (&gtest_ar,parser1.error_._M_cat,parser1.error_._M_value);
      std::operator<<((ostream *)(local_1a0._M_head_impl + 0x10),(string *)&gtest_ar);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__1,(internal *)&gtest_ar_,
                 (AssertionResult *)"parser1.has_error ()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,0x256,(char *)gtest_ar__1._0_8_);
      testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      std::__cxx11::string::~string((string *)&gtest_ar__1);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (local_1a0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1a0._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar__1._0_8_ =
         (long)fixups.
               super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)fixups.
               super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5;
    gtest_ar_.success_ = true;
    gtest_ar_._1_3_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)&gtest_ar,"fixups.size ()","1U",(unsigned_long *)&gtest_ar__1,
               (uint *)&gtest_ar_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,600,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar__1)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      if (gtest_ar__1._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&parser1);
      std::_Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ::~_Vector_base(&fixups.
                       super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                     );
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      gtest_ar__1._0_8_ = gtest_ar__1._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<long,int>
                ((internal *)&gtest_ar,"fixups[0].addend","0",
                 &(fixups.
                   super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                   ._M_impl.super__Vector_impl_data._M_start)->addend,(int *)&gtest_ar__1);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                   ,0x259,pcVar1);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&parser1);
      std::_Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ::~_Vector_base(&fixups.
                       super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                     );
      std::__cxx11::string::string
                ((string *)&gtest_ar,"{ \"name\":0, \"type\":17, \"offset\":19, \"addend\":true }",
                 (allocator *)&gtest_ar__1);
      anon_unknown.dwarf_38d868::ExternalFixupMembersImport::parse
                (&parser1,(string *)&gtest_ar,db,&imported_names);
      std::__cxx11::string::~string((string *)&gtest_ar);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = parser1.error_._M_value != 0;
      if (parser1.error_._M_value == 0) {
        testing::Message::Message((Message *)&fixups);
        std::operator<<((ostream *)
                        &(fixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start)->offset,
                        "Expected the parse to fail");
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar__1,
                   (AssertionResult *)"parser2.has_error ()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                   ,0x25f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&fixups);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (fixups.
            super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(((fixups.
                         super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                         ._M_impl.super__Vector_impl_data._M_start)->name).a_.a_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      eVar2 = pstore::exchange::import_ns::make_error_code(unexpected_boolean);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )eVar2._M_cat;
      gtest_ar__1._0_4_ = eVar2._M_value;
      testing::internal::CmpHelperEQ<std::error_code,std::error_code>
                ((internal *)&gtest_ar,"parser2.last_error ()",
                 "make_error_code (pstore::exchange::import_ns::error::unexpected_boolean)",
                 &parser1.error_,(error_code *)&gtest_ar__1);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&fixups,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                   ,0x261,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)&fixups,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fixups);
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&parser1);
    }
  }
  pstore::exchange::import_ns::string_mapping::~string_mapping(&imported_names);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&transaction);
  return;
}

Assistant:

TEST_F (ExternalFixupMembersImport, Addend) {
    mock_mutex mutex;
    auto transaction = begin (db_, transaction_lock{mutex});
    pstore::exchange::import_ns::string_mapping imported_names;
    ASSERT_EQ (imported_names.add_string (&transaction, "name"), std::error_code{});

    // The "addend" key is missing altogether. That's okay: the default is 0.
    {
        external_fixup_collection fixups;
        auto const parser1 =
            this->parse (R"({ "name":0, "type":17, "offset":19 })", &db_, imported_names, &fixups);
        EXPECT_FALSE (parser1.has_error ())
            << "JSON error was: " << parser1.last_error ().message ();
        ASSERT_EQ (fixups.size (), 1U);
        EXPECT_EQ (fixups[0].addend, 0);
    }
    // The "addend" key has the wrong type.
    {
        auto const parser2 = this->parse (R"({ "name":0, "type":17, "offset":19, "addend":true })",
                                          &db_, imported_names);
        EXPECT_TRUE (parser2.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser2.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::unexpected_boolean));
    }
}